

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ManEquivCountLitsAll(Gia_Man_t *p)

{
  int iVar1;
  undefined4 local_18;
  undefined4 local_14;
  int nLits;
  int i;
  Gia_Man_t *p_local;
  
  local_18 = 0;
  local_14 = 0;
  while( true ) {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= local_14) break;
    iVar1 = Gia_ObjRepr(p,local_14);
    local_18 = (uint)(iVar1 != 0xfffffff) + local_18;
    local_14 = local_14 + 1;
  }
  return local_18;
}

Assistant:

int Gia_ManEquivCountLitsAll( Gia_Man_t * p )
{
    int i, nLits = 0;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        nLits += (Gia_ObjRepr(p, i) != GIA_VOID);
    return nLits;
}